

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# closureHoisting.cpp
# Opt level: O0

void __thiscall
SQCompilation::ClosureHoistingOpt::HoistingVisitor::visitBlock(HoistingVisitor *this,Block *b)

{
  Block *in_RSI;
  HoistingVisitor *in_RDI;
  Statement *stmt;
  RelocateState state;
  ArenaVector<SQCompilation::Statement_*> *statements;
  HoistingVisitor *in_stack_ffffffffffffff90;
  RelocateState *in_stack_ffffffffffffffa0;
  RelocateState local_48;
  ArenaVector<SQCompilation::Statement_*> *local_18;
  
  local_18 = Block::statements(in_RSI);
  RelocateState::RelocateState
            (in_stack_ffffffffffffffa0,(ArenaVector<SQCompilation::Statement_*> *)in_RDI,
             in_stack_ffffffffffffff90);
  for (; local_48.index < local_48.size; local_48.index = local_48.index + 1) {
    ArenaVector<SQCompilation::Statement_*>::operator[](local_18,(size_type_conflict)local_48.index)
    ;
    Node::visit<SQCompilation::ClosureHoistingOpt::HoistingVisitor>
              ((Node *)in_stack_ffffffffffffffa0,in_RDI);
  }
  RelocateState::~RelocateState(&local_48);
  return;
}

Assistant:

void ClosureHoistingOpt::HoistingVisitor::visitBlock(Block *b) {
  auto &statements = b->statements();

  RelocateState state(statements, this);

  for (; state.index < state.size; ++state.index) {
    Statement *stmt = statements[state.index];
    stmt->visit(this);
  }
}